

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_vacuum.cpp
# Opt level: O2

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformVacuum(Transformer *this,PGVacuumStmt *stmt)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  undefined1 auVar2 [8];
  VacuumOptions VVar3;
  pointer pVVar4;
  pointer pVVar5;
  PGValue *pPVar6;
  long in_RDX;
  pointer *__ptr;
  undefined8 *puVar7;
  optional_ptr<duckdb_libpgquery::PGValue,_true> value;
  undefined1 local_38 [8];
  _Head_base<0UL,_duckdb::VacuumStatement_*,_false> local_30;
  
  VVar3 = ParseOptions(*(int32_t *)(in_RDX + 4));
  local_38[0] = VVar3.vacuum;
  local_38[1] = VVar3.analyze;
  make_uniq<duckdb::VacuumStatement,duckdb::VacuumOptions>
            ((duckdb *)&local_30,(VacuumOptions *)local_38);
  if (*(long *)(in_RDX + 8) != 0) {
    TransformRangeVar((Transformer *)local_38,(PGRangeVar *)stmt);
    pVVar4 = unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
             ::operator->((unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
                           *)&local_30);
    pVVar5 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
             operator->(&pVVar4->info);
    auVar2 = local_38;
    local_38 = (undefined1  [8])0x0;
    _Var1._M_head_impl =
         (pVVar5->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pVVar5->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)auVar2;
    if (_Var1._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
      if (local_38 != (undefined1  [8])0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_38)->ptr->options)();
      }
    }
    pVVar4 = unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
             ::operator->((unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
                           *)&local_30);
    pVVar5 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
             operator->(&pVVar4->info);
    pVVar5->has_table = true;
  }
  puVar7 = *(undefined8 **)(in_RDX + 0x10);
  if (puVar7 != (undefined8 *)0x0) {
    while (puVar7 = (undefined8 *)puVar7[1], puVar7 != (undefined8 *)0x0) {
      local_38 = (undefined1  [8])*puVar7;
      pVVar4 = unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
               ::operator->((unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
                             *)&local_30);
      pVVar5 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
               operator->(&pVVar4->info);
      pPVar6 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                         ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_38);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pVVar5->columns,&(pPVar6->val).str);
    }
  }
  (this->parent).ptr = (Transformer *)local_30._M_head_impl;
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformVacuum(duckdb_libpgquery::PGVacuumStmt &stmt) {
	auto result = make_uniq<VacuumStatement>(ParseOptions(stmt.options));

	if (stmt.relation) {
		result->info->ref = TransformRangeVar(*stmt.relation);
		result->info->has_table = true;
	}

	if (stmt.va_cols) {
		D_ASSERT(result->info->has_table);
		for (auto col_node = stmt.va_cols->head; col_node != nullptr; col_node = col_node->next) {
			auto value = PGPointerCast<duckdb_libpgquery::PGValue>(col_node->data.ptr_value);
			result->info->columns.emplace_back(value->val.str);
		}
	}
	return std::move(result);
}